

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O0

size_t __thiscall
cmDebugger_impl::ClearBreakpoint(cmDebugger_impl *this,string *fileName,size_t line)

{
  anon_class_16_2_5d60aac6_for__M_pred __pred;
  size_type sVar1;
  size_type sVar2;
  vector<cmBreakpoint,_std::allocator<cmBreakpoint>_> *this_00;
  __normal_iterator<cmBreakpoint_*,_std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>_>
  local_98;
  const_iterator local_90;
  size_type local_78;
  string *psStack_70;
  cmBreakpoint *local_60;
  __normal_iterator<cmBreakpoint_*,_std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>_>
  local_58;
  __normal_iterator<cmBreakpoint_*,_std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>_>
  local_50;
  const_iterator local_48;
  size_type local_40;
  size_type originalSize;
  anon_class_16_2_5d60aac6_for__M_pred pred;
  lock_guard<std::mutex> l;
  size_t line_local;
  string *fileName_local;
  cmDebugger_impl *this_local;
  
  l._M_device = (mutex_type *)line;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&pred.line,&this->breakpointMutex);
  pred.fileName = (string *)&l;
  this_00 = &this->breakpoints;
  originalSize = (size_type)fileName;
  local_40 = std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::size(this_00);
  local_58._M_current =
       (cmBreakpoint *)std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::begin(this_00);
  local_60 = (cmBreakpoint *)std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::end(this_00);
  local_78 = originalSize;
  psStack_70 = pred.fileName;
  __pred.line = (size_t *)pred.fileName;
  __pred.fileName = (string *)originalSize;
  local_50 = std::
             remove_if<__gnu_cxx::__normal_iterator<cmBreakpoint*,std::vector<cmBreakpoint,std::allocator<cmBreakpoint>>>,cmDebugger_impl::ClearBreakpoint(std::__cxx11::string_const&,unsigned_long)::_lambda(cmBreakpoint)_1_>
                       (local_58,(__normal_iterator<cmBreakpoint_*,_std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>_>
                                  )local_60,__pred);
  __gnu_cxx::
  __normal_iterator<cmBreakpoint_const*,std::vector<cmBreakpoint,std::allocator<cmBreakpoint>>>::
  __normal_iterator<cmBreakpoint*>
            ((__normal_iterator<cmBreakpoint_const*,std::vector<cmBreakpoint,std::allocator<cmBreakpoint>>>
              *)&local_48,&local_50);
  local_98._M_current =
       (cmBreakpoint *)
       std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::end(&this->breakpoints);
  __gnu_cxx::
  __normal_iterator<cmBreakpoint_const*,std::vector<cmBreakpoint,std::allocator<cmBreakpoint>>>::
  __normal_iterator<cmBreakpoint*>
            ((__normal_iterator<cmBreakpoint_const*,std::vector<cmBreakpoint,std::allocator<cmBreakpoint>>>
              *)&local_90,&local_98);
  std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::erase(this_00,local_48,local_90);
  sVar1 = local_40;
  sVar2 = std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::size(&this->breakpoints);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&pred.line);
  return sVar1 - sVar2;
}

Assistant:

size_t ClearBreakpoint(const std::string& fileName, size_t line) override
  {
    std::lock_guard<std::mutex> l(breakpointMutex);
    auto pred = [&](const cmBreakpoint br) {
      return br.matches(fileName, line);
    };
    auto originalSize = breakpoints.size();
    breakpoints.erase(
      std::remove_if(breakpoints.begin(), breakpoints.end(), pred),
      breakpoints.end());
    return originalSize - breakpoints.size();
  }